

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

bool __thiscall QRenderRule::baseStyleCanDraw(QRenderRule *this)

{
  int iVar1;
  QStyleSheetBackgroundData *pQVar2;
  char cVar3;
  
  if ((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) {
    return true;
  }
  cVar3 = QPixmap::isNull();
  iVar1 = *(int *)(*(long *)&((this->bg).d.ptr)->brush + 4);
  if (cVar3 == '\0') {
    if (iVar1 == 0) {
      cVar3 = QPixmap::isNull();
      if (cVar3 != '\0') {
        return true;
      }
      if ((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) goto LAB_0036b119;
    }
  }
  else if (iVar1 == 0) {
    return true;
  }
  cVar3 = QPixmap::isNull();
  if (cVar3 == '\0') {
    return false;
  }
  pQVar2 = (this->bg).d.ptr;
  if ((pQVar2 != (QStyleSheetBackgroundData *)0x0) &&
     (*(int *)(*(long *)&pQVar2->brush + 4) - 0xfU < 3)) {
    return (bool)(((byte)this->features & 2) >> 1);
  }
LAB_0036b119:
  return (bool)((byte)this->features & 1);
}

Assistant:

bool baseStyleCanDraw() const {
        if (!hasBackground() || (background()->brush.style() == Qt::NoBrush && bg->pixmap.isNull()))
            return true;
        if (bg && !bg->pixmap.isNull())
            return false;
        if (hasGradientBackground())
            return features & StyleFeature_BackgroundGradient;
        return features & StyleFeature_BackgroundColor;
    }